

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void mjs::throw_runtime_error(wstring_view *s,char *file,int line)

{
  char *local_48;
  size_t local_40;
  char local_38 [16];
  string_view local_28;
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<wchar_t_const*>
            ((string *)&local_48,s->_M_str,s->_M_str + s->_M_len);
  local_28._M_len = local_40;
  local_28._M_str = local_48;
  throw_runtime_error(&local_28,file,line);
}

Assistant:

[[noreturn]] void throw_runtime_error(const std::wstring_view& s, const char* file, int line) {
    throw_runtime_error(std::string(s.begin(), s.end()), file, line);
}